

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_9d58f::FixedBufString<1022>::appendScaled<1000>
          (FixedBufString<1022> *this,qreal value,char *unit)

{
  char *in_RDI;
  long in_FS_OFFSET;
  bool bVar1;
  double in_XMM0_Qa;
  FixedBufString<1022> *this_00;
  char *prefixes_1;
  char *prefixes;
  qint64 ratio;
  qreal v;
  char prefix [2];
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *format;
  double local_18;
  char local_a [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = in_XMM0_Qa;
  memset(local_a,0,2);
  this_00 = (FixedBufString<1022> *)qAbs<double>(&local_18);
  if (1.0 <= (double)this_00) {
    in_stack_ffffffffffffffb8 = "";
    for (format = (char *)0x1; (double)((long)format * 1000) < local_18;
        format = (char *)((long)format * 1000)) {
      in_stack_ffffffffffffffb8 = in_stack_ffffffffffffffb8 + 1;
    }
    local_a[0] = *in_stack_ffffffffffffffb8;
  }
  else {
    in_stack_ffffffffffffffc0 = "afpnum";
    while( true ) {
      format = (char *)0x0;
      bVar1 = false;
      if (1000.0 < local_18 * 0.0) {
        bVar1 = *in_stack_ffffffffffffffc0 != '\0';
      }
      if (!bVar1) break;
      in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1;
    }
    local_a[0] = *in_stack_ffffffffffffffc0;
  }
  local_18 = local_18 / (double)(long)format;
  (anonymous_namespace)::FixedBufString<1022>::appendf<double,char*,char_const*>
            (this_00,format,(double)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendScaled(qreal value, const char *unit)
    {
        char prefix[2] = {};
        qreal v = qAbs(value);
        qint64 ratio;
        if (v < 1 && Power == 1000) {
            const char *prefixes = submultiplePrefixes;
            ratio = qreal(std::atto::num) / qreal(std::atto::den);
            while (value * ratio > 1000 && *prefixes) {
                ++prefixes;
                ratio *= 1000;
            }
            prefix[0] = *prefixes;
        } else {
            const char *prefixes = multiplePrefixes;
            ratio = 1;
            while (value > 1000 * ratio) {  // yes, even for binary
                ++prefixes;
                ratio *= Power;
            }
            prefix[0] = *prefixes;
        }

        // adjust the value by the ratio
        value /= ratio;
        appendf(", %.3g %s%s", value, prefix, unit);
    }